

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.h
# Opt level: O0

void __thiscall cmCTestSVN::SVNInfo::SVNInfo(SVNInfo *this,string *path)

{
  string *path_local;
  SVNInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  std::__cxx11::string::string((string *)&this->URL);
  std::__cxx11::string::string((string *)&this->Root);
  std::__cxx11::string::string((string *)&this->Base);
  std::__cxx11::string::string((string *)&this->OldRevision);
  std::__cxx11::string::string((string *)&this->NewRevision);
  return;
}

Assistant:

SVNInfo(std::string const& path = std::string())
      : LocalPath(path)
    {
    }